

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.hpp
# Opt level: O2

string * format_string<unsigned_long,unsigned_long,unsigned_long,unsigned_long>
                   (string *__return_storage_ptr__,string *format,unsigned_long args,
                   unsigned_long args_1,unsigned_long args_2,unsigned_long args_3)

{
  ulong __maxlen;
  uint uVar1;
  tuple<char_*,_std::default_delete<char[]>_> __s;
  runtime_error *this;
  __uniq_ptr_impl<char,_std::default_delete<char[]>_> local_38;
  unique_ptr<char[],_std::default_delete<char[]>_> buf;
  
  uVar1 = snprintf((char *)0x0,0,(format->_M_dataplus)._M_p,args,args_1,args_2,args_3);
  if (-1 < (int)uVar1) {
    __maxlen = (ulong)uVar1 + 1;
    __s.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
    super__Head_base<0UL,_char_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>)operator_new__(__maxlen);
    local_38._M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
    super__Head_base<0UL,_char_*,_false>._M_head_impl =
         (tuple<char_*,_std::default_delete<char[]>_>)
         (tuple<char_*,_std::default_delete<char[]>_>)
         __s.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
         super__Head_base<0UL,_char_*,_false>._M_head_impl;
    snprintf((char *)__s.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                     super__Head_base<0UL,_char_*,_false>._M_head_impl,__maxlen,
             (format->_M_dataplus)._M_p,args,args_1,args_2,args_3);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,
               __s.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
               super__Head_base<0UL,_char_*,_false>._M_head_impl,
               (char *)((long)__s.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                              super__Head_base<0UL,_char_*,_false>._M_head_impl + (ulong)uVar1));
    std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
              ((unique_ptr<char[],_std::default_delete<char[]>_> *)&local_38);
    return __return_storage_ptr__;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"Error during formatting.");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::string format_string(const std::string &format, Args ... args) {
  int size = snprintf(nullptr, 0, format.c_str(), args ...) + 1; // Extra space for '\0'
  if (size <= 0) { throw std::runtime_error("Error during formatting."); }
  std::unique_ptr<char[]> buf(new char[size]);
  snprintf(buf.get(), static_cast<size_t>(size), format.c_str(), args ...);
  return std::string(buf.get(), buf.get() + size - 1); // We don't want the '\0' inside
}